

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmAddCustomTargetCommand.cxx
# Opt level: O3

bool __thiscall
cmAddCustomTargetCommand::InitialPass
          (cmAddCustomTargetCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  pointer pcVar1;
  cmMakefile *pcVar2;
  undefined1 uVar3;
  byte bVar4;
  bool bVar5;
  int iVar6;
  PolicyStatus PVar7;
  long lVar8;
  ostream *poVar9;
  ulong uVar10;
  char *pcVar11;
  cmTarget *this_00;
  uint uVar12;
  PolicyID id;
  bool bVar13;
  MessageType t;
  value_type *__x;
  pointer pbVar14;
  undefined1 uVar15;
  bool local_2d8;
  bool local_2cc;
  string working_directory;
  string local_2a8;
  string targetName;
  cmCustomCommandLine currentLine;
  char *local_250;
  cmCustomCommandLines commandLines;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  byproducts;
  string comment_buffer;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  sources;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  depends;
  ostringstream e;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198 [6];
  ios_base local_138 [264];
  
  pbVar14 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  if ((args->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish == pbVar14) {
    _e = (pointer)local_198;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&e,"called with incorrect number of arguments","");
    cmCommand::SetError(&this->super_cmCommand,(string *)&e);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_e != local_198) {
      operator_delete(_e,CONCAT71(local_198[0]._M_allocated_capacity._1_7_,
                                  local_198[0]._M_local_buf[0]) + 1);
    }
    return false;
  }
  targetName._M_dataplus._M_p = (pointer)&targetName.field_2;
  pcVar1 = (pbVar14->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&targetName,pcVar1,pcVar1 + pbVar14->_M_string_length);
  lVar8 = std::__cxx11::string::find_first_of((char *)&targetName,0x4d4801,0);
  if (lVar8 != -1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&e,"called with invalid target name \"",0x21);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&e,targetName._M_dataplus._M_p,targetName._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9,"\".  Target names may not contain a slash.  ",0x2b);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9,"Use ADD_CUSTOM_COMMAND to generate files.",0x29);
    std::__cxx11::stringbuf::str();
    cmCommand::SetError(&this->super_cmCommand,&working_directory);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)working_directory._M_dataplus._M_p != &working_directory.field_2) {
      operator_delete(working_directory._M_dataplus._M_p,
                      CONCAT71(working_directory.field_2._M_allocated_capacity._1_7_,
                               working_directory.field_2._M_local_buf[0]) + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
    std::ios_base::~ios_base(local_138);
    bVar13 = false;
    goto LAB_002bbc0e;
  }
  currentLine.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  currentLine.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  currentLine.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  commandLines.super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
  super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  commandLines.super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
  super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  commandLines.super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
  super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  depends.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  depends.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  depends.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  byproducts.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  byproducts.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  byproducts.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  working_directory._M_dataplus._M_p = (pointer)&working_directory.field_2;
  working_directory._M_string_length = 0;
  working_directory.field_2._M_local_buf[0] = '\0';
  comment_buffer._M_dataplus._M_p = (pointer)&comment_buffer.field_2;
  comment_buffer._M_string_length = 0;
  comment_buffer.field_2._M_local_buf[0] = '\0';
  sources.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  sources.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  sources.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pbVar14 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  uVar10 = (long)(args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar14;
  uVar12 = 1;
  if (uVar10 < 0x21) {
    local_2cc = true;
  }
  else {
    iVar6 = std::__cxx11::string::compare((char *)(pbVar14 + 1));
    local_2cc = iVar6 != 0;
    uVar12 = 2 - local_2cc;
    pbVar14 = (args->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    uVar10 = (long)(args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar14;
  }
  local_2d8 = true;
  bVar13 = false;
  if ((ulong)uVar12 < (ulong)((long)uVar10 >> 5)) {
    bVar4 = 0;
    local_250 = (char *)0x0;
    uVar10 = (ulong)uVar12;
    uVar15 = bVar13;
    bVar13 = false;
LAB_002bb792:
    uVar12 = uVar12 + 1;
    __x = pbVar14 + uVar10;
    iVar6 = std::__cxx11::string::compare((char *)__x);
    uVar3 = 1;
    if (iVar6 != 0) {
      iVar6 = std::__cxx11::string::compare((char *)__x);
      uVar3 = 2;
      if (iVar6 != 0) {
        iVar6 = std::__cxx11::string::compare((char *)__x);
        uVar3 = 3;
        if (iVar6 != 0) {
          iVar6 = std::__cxx11::string::compare((char *)__x);
          if (iVar6 == 0) {
            bVar4 = 1;
          }
          else {
            iVar6 = std::__cxx11::string::compare((char *)__x);
            if (iVar6 != 0) {
              iVar6 = std::__cxx11::string::compare((char *)__x);
              if (iVar6 == 0) {
LAB_002bb910:
                uVar3 = 4;
              }
              else {
                iVar6 = std::__cxx11::string::compare((char *)__x);
                if (iVar6 == 0) {
                  uVar3 = 0;
                  if (currentLine.
                      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start !=
                      currentLine.
                      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish) {
                    std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::
                    push_back(&commandLines.
                               super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>
                              ,&currentLine);
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::_M_erase_at_end(&currentLine.
                                       super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ,currentLine.
                                       super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       .
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start);
                    uVar3 = 0;
                  }
                }
                else {
                  iVar6 = std::__cxx11::string::compare((char *)__x);
                  if (iVar6 == 0) {
                    uVar3 = 5;
                  }
                  else {
                    switch(uVar15) {
                    case 0:
                      std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::push_back(&currentLine.
                                   super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ,__x);
                      uVar3 = 0;
                      break;
                    case 1:
                      pcVar1 = (__x->_M_dataplus)._M_p;
                      _e = (pointer)local_198;
                      std::__cxx11::string::_M_construct<char*>
                                ((string *)&e,pcVar1,pcVar1 + __x->_M_string_length);
                      cmsys::SystemTools::ConvertToUnixSlashes((string *)&e);
                      std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::push_back(&depends,(string *)&e);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)_e != local_198) {
                        operator_delete(_e,CONCAT71(local_198[0]._M_allocated_capacity._1_7_,
                                                    local_198[0]._M_local_buf[0]) + 1);
                      }
                      uVar3 = 1;
                      break;
                    case 2:
                      local_198[0]._M_local_buf[0] = '\0';
                      _e = (pointer)local_198;
                      bVar5 = cmsys::SystemTools::FileIsFullPath((__x->_M_dataplus)._M_p);
                      if (!bVar5) {
                        pcVar11 = cmMakefile::GetCurrentBinaryDirectory
                                            ((this->super_cmCommand).Makefile);
                        std::__cxx11::string::operator=((string *)&e,pcVar11);
                        std::__cxx11::string::append((char *)&e);
                      }
                      std::__cxx11::string::_M_append((char *)&e,(ulong)(__x->_M_dataplus)._M_p);
                      cmsys::SystemTools::ConvertToUnixSlashes((string *)&e);
                      std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::push_back(&byproducts,(string *)&e);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)_e != local_198) {
                        operator_delete(_e,CONCAT71(local_198[0]._M_allocated_capacity._1_7_,
                                                    local_198[0]._M_local_buf[0]) + 1);
                      }
                      uVar3 = 2;
                      break;
                    case 3:
                      std::__cxx11::string::_M_assign((string *)&working_directory);
                      break;
                    case 4:
                      std::__cxx11::string::_M_assign((string *)&comment_buffer);
                      local_250 = comment_buffer._M_dataplus._M_p;
                      goto LAB_002bb910;
                    case 5:
                      std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::push_back(&sources,__x);
                      uVar3 = 5;
                      break;
                    default:
                      _e = (pointer)local_198;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)&e,"Wrong syntax. Unknown type of argument.","");
                      cmCommand::SetError(&this->super_cmCommand,(string *)&e);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)_e != local_198) {
                        operator_delete(_e,CONCAT71(local_198[0]._M_allocated_capacity._1_7_,
                                                    local_198[0]._M_local_buf[0]) + 1);
                      }
                      goto LAB_002bbb8f;
                    }
                  }
                }
              }
              goto LAB_002bb916;
            }
            bVar13 = true;
          }
          uVar3 = 6;
        }
      }
    }
LAB_002bb916:
    uVar15 = uVar3;
    pbVar14 = (args->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    uVar10 = (ulong)uVar12;
    if ((ulong)((long)(args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar14 >> 5) <=
        (ulong)uVar12) goto LAB_002bba90;
    goto LAB_002bb792;
  }
  local_250 = (char *)0x0;
LAB_002bbab3:
  lVar8 = std::__cxx11::string::find_first_of((char *)&targetName,0x4cffff,0);
  if (lVar8 == -1) {
    bVar5 = cmGeneratorExpression::IsValidTargetName(&targetName);
    if (((!bVar5) || (bVar5 = cmGlobalGenerator::IsReservedTarget(&targetName), bVar5)) ||
       (lVar8 = std::__cxx11::string::find((char *)&targetName,0x4f0f30,0), lVar8 != -1)) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
      PVar7 = cmMakefile::GetPolicyStatus((this->super_cmCommand).Makefile,CMP0037);
      if (PVar7 - NEW < 3) {
        t = FATAL_ERROR;
        bVar5 = true;
LAB_002bbd0a:
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&e,"The target name \"",0x11);
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&e,targetName._M_dataplus._M_p,targetName._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar9,
                   "\" is reserved or not valid for certain CMake features, such as generator expressions, and may result in undefined behavior."
                   ,0x7b);
        pcVar2 = (this->super_cmCommand).Makefile;
        std::__cxx11::stringbuf::str();
        cmMakefile::IssueMessage(pcVar2,t,&local_2a8,false);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT71(local_2a8._M_dataplus._M_p._1_7_,(char)local_2a8._M_dataplus._M_p) !=
            &local_2a8.field_2) {
          operator_delete((undefined1 *)
                          CONCAT71(local_2a8._M_dataplus._M_p._1_7_,(char)local_2a8._M_dataplus._M_p
                                  ),local_2a8.field_2._M_allocated_capacity + 1);
        }
        if (bVar5) goto LAB_002bbb6e;
      }
      else if (PVar7 == WARN) {
        cmPolicies::GetPolicyWarning_abi_cxx11_(&local_2a8,(cmPolicies *)0x25,id);
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&e,
                            (char *)CONCAT71(local_2a8._M_dataplus._M_p._1_7_,
                                             (char)local_2a8._M_dataplus._M_p),
                            local_2a8._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT71(local_2a8._M_dataplus._M_p._1_7_,(char)local_2a8._M_dataplus._M_p) !=
            &local_2a8.field_2) {
          operator_delete((undefined1 *)
                          CONCAT71(local_2a8._M_dataplus._M_p._1_7_,(char)local_2a8._M_dataplus._M_p
                                  ),local_2a8.field_2._M_allocated_capacity + 1);
        }
        bVar5 = false;
        t = AUTHOR_WARNING;
        goto LAB_002bbd0a;
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
      std::ios_base::~ios_base(local_138);
    }
    if (currentLine.
        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        currentLine.
        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::push_back
                (&commandLines.
                  super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>,
                 &currentLine);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::_M_erase_at_end(&currentLine.
                         super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ,currentLine.
                         super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start);
    }
    local_198[0]._M_local_buf[0] = '\0';
    _e = (pointer)local_198;
    bVar5 = cmMakefile::EnforceUniqueName
                      ((this->super_cmCommand).Makefile,&targetName,(string *)&e,true);
    if (bVar5) {
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_e != local_198) {
        operator_delete(_e,CONCAT71(local_198[0]._M_allocated_capacity._1_7_,
                                    local_198[0]._M_local_buf[0]) + 1);
      }
      if (working_directory._M_string_length != 0) {
        pcVar11 = cmMakefile::GetCurrentBinaryDirectory((this->super_cmCommand).Makefile);
        cmsys::SystemTools::CollapseFullPath((string *)&e,&working_directory,pcVar11);
        std::__cxx11::string::operator=((string *)&working_directory,(string *)&e);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_e != local_198) {
          operator_delete(_e,CONCAT71(local_198[0]._M_allocated_capacity._1_7_,
                                      local_198[0]._M_local_buf[0]) + 1);
        }
      }
      if (commandLines.super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
          super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
          super__Vector_impl_data._M_start ==
          commandLines.super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
          super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        if (byproducts.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start ==
            byproducts.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          if (bVar13 == false) goto LAB_002bbebc;
          pcVar2 = (this->super_cmCommand).Makefile;
          _e = (pointer)local_198;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&e,"USES_TERMINAL may not be specified without any COMMAND","");
          cmMakefile::IssueMessage(pcVar2,FATAL_ERROR,(string *)&e,false);
        }
        else {
          pcVar2 = (this->super_cmCommand).Makefile;
          _e = (pointer)local_198;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&e,"BYPRODUCTS may not be specified without any COMMAND","");
          cmMakefile::IssueMessage(pcVar2,FATAL_ERROR,(string *)&e,false);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_e != local_198) {
          operator_delete(_e,CONCAT71(local_198[0]._M_allocated_capacity._1_7_,
                                      local_198[0]._M_local_buf[0]) + 1);
        }
        bVar13 = true;
      }
      else {
LAB_002bbebc:
        this_00 = cmMakefile::AddUtilityCommand
                            ((this->super_cmCommand).Makefile,&targetName,local_2cc,
                             working_directory._M_dataplus._M_p,&byproducts,&depends,&commandLines,
                             local_2d8,local_250,bVar13);
        bVar13 = true;
        cmTarget::AddSources(this_00,&sources);
      }
    }
    else {
      cmCommand::SetError(&this->super_cmCommand,(string *)&e);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_e != local_198) {
        operator_delete(_e,CONCAT71(local_198[0]._M_allocated_capacity._1_7_,
                                    local_198[0]._M_local_buf[0]) + 1);
      }
      bVar13 = false;
    }
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&e,"called with target name containing a \"",0x26);
    local_2a8._M_dataplus._M_p._0_1_ = targetName._M_dataplus._M_p[lVar8];
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)&e,(char *)&local_2a8,1);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9,"\".  This character is not allowed.",0x22);
    std::__cxx11::stringbuf::str();
    cmCommand::SetError(&this->super_cmCommand,&local_2a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_2a8._M_dataplus._M_p._1_7_,(char)local_2a8._M_dataplus._M_p) !=
        &local_2a8.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_2a8._M_dataplus._M_p._1_7_,(char)local_2a8._M_dataplus._M_p),
                      local_2a8.field_2._M_allocated_capacity + 1);
    }
LAB_002bbb6e:
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
    std::ios_base::~ios_base(local_138);
LAB_002bbb8f:
    bVar13 = false;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&sources);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)comment_buffer._M_dataplus._M_p != &comment_buffer.field_2) {
    operator_delete(comment_buffer._M_dataplus._M_p,
                    CONCAT71(comment_buffer.field_2._M_allocated_capacity._1_7_,
                             comment_buffer.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)working_directory._M_dataplus._M_p != &working_directory.field_2) {
    operator_delete(working_directory._M_dataplus._M_p,
                    CONCAT71(working_directory.field_2._M_allocated_capacity._1_7_,
                             working_directory.field_2._M_local_buf[0]) + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&byproducts);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&depends);
  std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::~vector
            (&commandLines.super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&currentLine.
             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           );
LAB_002bbc0e:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)targetName._M_dataplus._M_p != &targetName.field_2) {
    operator_delete(targetName._M_dataplus._M_p,targetName.field_2._M_allocated_capacity + 1);
  }
  return bVar13;
LAB_002bba90:
  local_2d8 = (bool)(bVar4 ^ 1);
  goto LAB_002bbab3;
}

Assistant:

bool cmAddCustomTargetCommand
::InitialPass(std::vector<std::string> const& args,
              cmExecutionStatus&)
{
  if(args.size() < 1 )
    {
    this->SetError("called with incorrect number of arguments");
    return false;
    }

  std::string targetName = args[0];

  // Check the target name.
  if(targetName.find_first_of("/\\") != targetName.npos)
    {
    std::ostringstream e;
    e << "called with invalid target name \"" << targetName
      << "\".  Target names may not contain a slash.  "
      << "Use ADD_CUSTOM_COMMAND to generate files.";
    this->SetError(e.str());
    return false;
    }

  // Accumulate one command line at a time.
  cmCustomCommandLine currentLine;

  // Save all command lines.
  cmCustomCommandLines commandLines;

  // Accumulate dependencies.
  std::vector<std::string> depends, byproducts;
  std::string working_directory;
  bool verbatim = false;
  bool uses_terminal = false;
  std::string comment_buffer;
  const char* comment = 0;
  std::vector<std::string> sources;

  // Keep track of parser state.
  enum tdoing {
    doing_command,
    doing_depends,
    doing_byproducts,
    doing_working_directory,
    doing_comment,
    doing_source,
    doing_nothing
  };
  tdoing doing = doing_command;

  // Look for the ALL option.
  bool excludeFromAll = true;
  unsigned int start = 1;
  if(args.size() > 1)
    {
    if(args[1] == "ALL")
      {
      excludeFromAll = false;
      start = 2;
      }
    }

  // Parse the rest of the arguments.
  for(unsigned int j = start; j < args.size(); ++j)
    {
    std::string const& copy = args[j];

    if(copy == "DEPENDS")
      {
      doing = doing_depends;
      }
    else if(copy == "BYPRODUCTS")
      {
      doing = doing_byproducts;
      }
    else if(copy == "WORKING_DIRECTORY")
      {
      doing = doing_working_directory;
      }
    else if(copy == "VERBATIM")
      {
      doing = doing_nothing;
      verbatim = true;
      }
    else if(copy == "USES_TERMINAL")
      {
      doing = doing_nothing;
      uses_terminal = true;
      }
    else if (copy == "COMMENT")
      {
      doing = doing_comment;
      }
    else if(copy == "COMMAND")
      {
      doing = doing_command;

      // Save the current command before starting the next command.
      if(!currentLine.empty())
        {
        commandLines.push_back(currentLine);
        currentLine.clear();
        }
      }
    else if(copy == "SOURCES")
      {
      doing = doing_source;
      }
    else
      {
      switch (doing)
        {
        case doing_working_directory:
          working_directory = copy;
          break;
        case doing_command:
          currentLine.push_back(copy);
          break;
        case doing_byproducts:
          {
          std::string filename;
          if (!cmSystemTools::FileIsFullPath(copy.c_str()))
            {
            filename = this->Makefile->GetCurrentBinaryDirectory();
            filename += "/";
            }
          filename += copy;
          cmSystemTools::ConvertToUnixSlashes(filename);
          byproducts.push_back(filename);
          }
          break;
        case doing_depends:
          {
          std::string dep = copy;
          cmSystemTools::ConvertToUnixSlashes(dep);
          depends.push_back(dep);
          }
          break;
         case doing_comment:
           comment_buffer = copy;
           comment = comment_buffer.c_str();
           break;
        case doing_source:
          sources.push_back(copy);
          break;
        default:
          this->SetError("Wrong syntax. Unknown type of argument.");
          return false;
        }
      }
    }

  std::string::size_type pos = targetName.find_first_of("#<>");
  if(pos != targetName.npos)
    {
    std::ostringstream msg;
    msg << "called with target name containing a \"" << targetName[pos]
        << "\".  This character is not allowed.";
    this->SetError(msg.str());
    return false;
    }

  // Some requirements on custom target names already exist
  // and have been checked at this point.
  // The following restrictions overlap but depend on policy CMP0037.
  bool nameOk = cmGeneratorExpression::IsValidTargetName(targetName) &&
    !cmGlobalGenerator::IsReservedTarget(targetName);
  if (nameOk)
    {
    nameOk = targetName.find(":") == std::string::npos;
    }
  if (!nameOk)
    {
    cmake::MessageType messageType = cmake::AUTHOR_WARNING;
    std::ostringstream e;
    bool issueMessage = false;
    switch(this->Makefile->GetPolicyStatus(cmPolicies::CMP0037))
      {
      case cmPolicies::WARN:
        e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0037) << "\n";
        issueMessage = true;
      case cmPolicies::OLD:
        break;
      case cmPolicies::NEW:
      case cmPolicies::REQUIRED_IF_USED:
      case cmPolicies::REQUIRED_ALWAYS:
        issueMessage = true;
        messageType = cmake::FATAL_ERROR;
      }
    if (issueMessage)
      {
      e << "The target name \"" << targetName <<
          "\" is reserved or not valid for certain "
          "CMake features, such as generator expressions, and may result "
          "in undefined behavior.";
      this->Makefile->IssueMessage(messageType, e.str());

      if (messageType == cmake::FATAL_ERROR)
        {
        return false;
        }
      }
    }

  // Store the last command line finished.
  if(!currentLine.empty())
    {
    commandLines.push_back(currentLine);
    currentLine.clear();
    }

  // Enforce name uniqueness.
  {
  std::string msg;
  if(!this->Makefile->EnforceUniqueName(targetName, msg, true))
    {
    this->SetError(msg);
    return false;
    }
  }

  // Convert working directory to a full path.
  if(!working_directory.empty())
    {
    const char* build_dir = this->Makefile->GetCurrentBinaryDirectory();
    working_directory =
      cmSystemTools::CollapseFullPath(working_directory, build_dir);
    }

  if (commandLines.empty() && !byproducts.empty())
    {
    this->Makefile->IssueMessage(cmake::FATAL_ERROR,
      "BYPRODUCTS may not be specified without any COMMAND");
    return true;
    }
  if (commandLines.empty() && uses_terminal)
    {
    this->Makefile->IssueMessage(cmake::FATAL_ERROR,
      "USES_TERMINAL may not be specified without any COMMAND");
    return true;
    }

  // Add the utility target to the makefile.
  bool escapeOldStyle = !verbatim;
  cmTarget* target =
    this->Makefile->AddUtilityCommand(targetName, excludeFromAll,
                                      working_directory.c_str(),
                                      byproducts, depends,
                                      commandLines, escapeOldStyle, comment,
                                      uses_terminal);

  // Add additional user-specified source files to the target.
  target->AddSources(sources);

  return true;
}